

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valuemapper.hpp
# Opt level: O0

UserObject *
camp_ext::ValueMapper<camp::UserObject,_void>::from
          (UserObject *__return_storage_ptr__,EnumObject *param_1)

{
  BadType *__return_storage_ptr___00;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  BadType local_60;
  EnumObject *local_18;
  EnumObject *param_0_local;
  
  local_18 = param_1;
  param_0_local = (EnumObject *)__return_storage_ptr__;
  __return_storage_ptr___00 = (BadType *)__cxa_allocate_exception(0x48);
  camp::BadType::BadType(&local_60,enumType,userType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/include/camp/valuemapper.hpp"
             ,&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,
             "static camp::UserObject camp_ext::ValueMapper<camp::UserObject>::from(const camp::EnumObject &)"
             ,&local_b9);
  camp::Error::prepare<camp::BadType>
            (__return_storage_ptr___00,&local_60,(string *)local_90,0x160,(string *)local_b8);
  __cxa_throw(__return_storage_ptr___00,&camp::BadType::typeinfo,camp::BadType::~BadType);
}

Assistant:

static camp::UserObject from(const camp::EnumObject&) {CAMP_ERROR(camp::BadType(camp::enumType,     camp::userType));}